

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::check_quant_tables(jpeg_decoder *this)

{
  long lVar1;
  
  if (0 < (long)this->m_comps_in_scan) {
    lVar1 = 0;
    do {
      if (this->m_quant[this->m_comp_quant[this->m_comp_list[lVar1]]] == (jpgd_quant_t *)0x0) {
        stop_decoding(this,JPGD_UNDEFINED_QUANT_TABLE);
      }
      lVar1 = lVar1 + 1;
    } while (this->m_comps_in_scan != lVar1);
  }
  return;
}

Assistant:

void jpeg_decoder::check_quant_tables()
	{
		for (int i = 0; i < m_comps_in_scan; i++)
			if (m_quant[m_comp_quant[m_comp_list[i]]] == nullptr)
				stop_decoding(JPGD_UNDEFINED_QUANT_TABLE);
	}